

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

ssize_t httplib::detail::read_socket(socket_t sock,void *ptr,size_t size,int flags)

{
  anon_class_32_4_210d28e3 fn;
  ssize_t sVar1;
  undefined4 in_ECX;
  undefined4 in_EDI;
  int local_8 [2];
  
  fn.ptr._0_4_ = in_ECX;
  fn.sock = (socket_t *)&stack0xffffffffffffffc8;
  fn.ptr._4_4_ = in_EDI;
  fn.size = (size_t *)&stack0xffffffffffffffcc;
  fn.flags = local_8;
  sVar1 = handle_EINTR<httplib::detail::read_socket(int,void*,unsigned_long,int)::_lambda()_1_>(fn);
  return sVar1;
}

Assistant:

inline ssize_t read_socket(socket_t sock, void *ptr, size_t size, int flags) {
  return handle_EINTR([&]() {
    return recv(sock,
#ifdef _WIN32
                static_cast<char *>(ptr), static_cast<int>(size),
#else
                ptr, size,
#endif
                flags);
  });
}